

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O0

void crnlib::console::remove_console_output_func(console_output_func pFunc)

{
  uint uVar1;
  console_func *pcVar2;
  uint local_1c;
  int i;
  scoped_mutex lock;
  console_output_func pFunc_local;
  
  lock.m_mutex = (mutex *)pFunc;
  init((EVP_PKEY_CTX *)pFunc);
  scoped_mutex::scoped_mutex((scoped_mutex *)&stack0xffffffffffffffe8,m_pMutex);
  local_1c = vector<crnlib::console::console_func>::size
                       ((vector<crnlib::console::console_func> *)m_output_funcs);
  while (local_1c = local_1c - 1, -1 < (int)local_1c) {
    pcVar2 = vector<crnlib::console::console_func>::operator[]
                       ((vector<crnlib::console::console_func> *)m_output_funcs,local_1c);
    if ((mutex *)pcVar2->m_func == lock.m_mutex) {
      pcVar2 = vector<crnlib::console::console_func>::begin
                         ((vector<crnlib::console::console_func> *)m_output_funcs);
      vector<crnlib::console::console_func>::erase
                ((vector<crnlib::console::console_func> *)m_output_funcs,pcVar2 + (int)local_1c);
    }
  }
  uVar1 = vector<crnlib::console::console_func>::size
                    ((vector<crnlib::console::console_func> *)m_output_funcs);
  if (uVar1 == 0) {
    vector<crnlib::console::console_func>::clear
              ((vector<crnlib::console::console_func> *)m_output_funcs);
  }
  scoped_mutex::~scoped_mutex((scoped_mutex *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void console::remove_console_output_func(console_output_func pFunc)
    {
        init();

        scoped_mutex lock(*m_pMutex);

        for (int i = m_output_funcs.size() - 1; i >= 0; i--)
        {
            if (m_output_funcs[i].m_func == pFunc)
            {
                m_output_funcs.erase(m_output_funcs.begin() + i);
            }
        }

        if (!m_output_funcs.size())
        {
            m_output_funcs.clear();
        }
    }